

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall Selector::Selector(Selector *this,char *name)

{
  int iVar1;
  char *local_68;
  int res;
  char *name_local;
  Selector *this_local;
  
  EventDispatcher::EventDispatcher(&this->super_EventDispatcher);
  (this->super_EventDispatcher).super_IEventDispatcher._vptr_IEventDispatcher =
       (_func_int **)&PTR_sendEventSync_00147850;
  JetHead::list<Selector::ListenerNode_*>::list(&this->mList);
  Mutex::Mutex(&this->mLock,true);
  local_68 = name;
  if (name == (char *)0x0) {
    local_68 = "Selector";
  }
  JHThread::Runnable<Selector>::Runnable
            (&this->mThread,local_68,this,(thread_main_type)threadMain,false,0);
  this->mUpdateFds = false;
  Condition::Condition(&this->mCondition);
  iVar1 = pipe(this->mPipe);
  if (iVar1 != 0) {
    jh_log_print(1,"Selector::Selector(const char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                 ,0x33,"failed to create pipe");
  }
  this->mRunning = true;
  JHThread::Thread::Start(&(this->mThread).super_Thread);
  this->mShutdown = false;
  return;
}

Assistant:

Selector::Selector( const char *name ) : mLock( true ), 
	mThread( name == NULL ? "Selector" : name, this, &Selector::threadMain ),
	mUpdateFds( false )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int res = pipe( mPipe );
	
	LOG( "pipe reader %d writer %d", mPipe[ PIPE_READER ], mPipe[ PIPE_WRITER ] );
	
	if ( res != 0 )
		LOG_ERR_FATAL( "failed to create pipe" );	

	mRunning = true;
	mThread.Start();
	mShutdown = false;
}